

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::DistConstraintListSyntax::setChild
          (DistConstraintListSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  size_type sVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  SeparatedSyntaxList<slang::syntax::DistItemSyntax> *pSVar7;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar8;
  logic_error *this_00;
  long *plVar9;
  size_type *psVar10;
  long *plVar11;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index < 4) {
    switch(index) {
    case 0:
      pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
      uVar3 = pvVar8->field_0x2;
      NVar4.raw = (pvVar8->numFlags).raw;
      uVar5 = pvVar8->rawLen;
      pIVar1 = pvVar8->info;
      (this->dist).kind = pvVar8->kind;
      (this->dist).field_0x2 = uVar3;
      (this->dist).numFlags = (NumericTokenFlags)NVar4.raw;
      (this->dist).rawLen = uVar5;
      (this->dist).info = pIVar1;
      break;
    case 1:
      pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
      uVar3 = pvVar8->field_0x2;
      NVar4.raw = (pvVar8->numFlags).raw;
      uVar5 = pvVar8->rawLen;
      pIVar1 = pvVar8->info;
      (this->openBrace).kind = pvVar8->kind;
      (this->openBrace).field_0x2 = uVar3;
      (this->openBrace).numFlags = (NumericTokenFlags)NVar4.raw;
      (this->openBrace).rawLen = uVar5;
      (this->openBrace).info = pIVar1;
      break;
    case 2:
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar7 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>>
                         (*ppSVar6);
      (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar7->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar7->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->items).super_SyntaxListBase.childCount = (pSVar7->super_SyntaxListBase).childCount;
      sVar2 = (pSVar7->elements).size_;
      (this->items).elements.data_ = (pSVar7->elements).data_;
      (this->items).elements.size_ = sVar2;
      break;
    case 3:
      pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
      uVar3 = pvVar8->field_0x2;
      NVar4.raw = (pvVar8->numFlags).raw;
      uVar5 = pvVar8->rawLen;
      pIVar1 = pvVar8->info;
      (this->closeBrace).kind = pvVar8->kind;
      (this->closeBrace).field_0x2 = uVar3;
      (this->closeBrace).numFlags = (NumericTokenFlags)NVar4.raw;
      (this->closeBrace).rawLen = uVar5;
      (this->closeBrace).info = pIVar1;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
             ,"");
  plVar9 = (long *)std::__cxx11::string::append((char *)local_90);
  local_d0._M_dataplus._M_p = (pointer)*plVar9;
  psVar10 = (size_type *)(plVar9 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
    local_d0.field_2._M_allocated_capacity = *psVar10;
    local_d0.field_2._8_8_ = plVar9[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar10;
  }
  local_d0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x11c7);
  std::operator+(&local_50,&local_d0,&local_70);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar9;
  plVar11 = plVar9 + 2;
  if (local_b0 == plVar11) {
    local_a0 = *plVar11;
    lStack_98 = plVar9[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar11;
  }
  local_a8 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f0 = (long *)*plVar9;
  plVar11 = plVar9 + 2;
  if (local_f0 == plVar11) {
    local_e0 = *plVar11;
    lStack_d8 = plVar9[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar11;
  }
  local_e8 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DistConstraintListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dist = child.token(); return;
        case 1: openBrace = child.token(); return;
        case 2: items = child.node()->as<SeparatedSyntaxList<DistItemSyntax>>(); return;
        case 3: closeBrace = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}